

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O2

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  char *pcVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  cmSourceFile *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *sourceName;
  string *__return_storage_ptr__;
  string *psVar10;
  string sourceListValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string driver;
  string functionMapCode;
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string extraInclude;
  string local_f0;
  string configFile;
  string function;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar7 - (long)__lhs) < 0x41) {
    std::__cxx11::string::string
              ((string *)&extraInclude,"called with wrong number of arguments.",
               (allocator *)&function);
    cmCommand::SetError(&this->super_cmCommand,&extraInclude);
    std::__cxx11::string::~string((string *)&extraInclude);
    bVar5 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (; pbVar4 = tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, __lhs != pbVar7; __lhs = __lhs + 1) {
      bVar5 = std::operator==(__lhs,"EXTRA_INCLUDE");
      if (bVar5) {
        __lhs = __lhs + 1;
        if (__lhs == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&driver,"incorrect arguments to EXTRA_INCLUDE",
                     (allocator *)&configFile);
          cmCommand::SetError(&this->super_cmCommand,&driver);
          goto LAB_0029a728;
        }
        std::__cxx11::string::assign((char *)&extraInclude);
        std::__cxx11::string::append((string *)&extraInclude);
        std::__cxx11::string::append((char *)&extraInclude);
      }
      else {
        bVar5 = std::operator==(__lhs,"FUNCTION");
        if (bVar5) {
          __lhs = __lhs + 1;
          if (__lhs == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string
                      ((string *)&driver,"incorrect arguments to FUNCTION",(allocator *)&configFile)
            ;
            cmCommand::SetError(&this->super_cmCommand,&driver);
            goto LAB_0029a728;
          }
          std::__cxx11::string::_M_assign((string *)&function);
          std::__cxx11::string::append((char *)&function);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests,__lhs);
        }
      }
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    pcVar1 = ((tests.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&driver,tests.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::~string((string *)&driver);
    if (driver._M_string_length < 2) {
      std::__cxx11::string::string
                ((string *)&driver,"You must specify a file extension for the test driver file.",
                 (allocator *)&configFile);
      cmCommand::SetError(&this->super_cmCommand,&driver);
LAB_0029a728:
      std::__cxx11::string::~string((string *)&driver);
      bVar5 = false;
    }
    else {
      pcVar8 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&driver,pcVar8,(allocator *)&configFile);
      std::__cxx11::string::append((char *)&driver);
      std::__cxx11::string::append((string *)&driver);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string
                ((string *)&forwardDeclareCode,"CMAKE_ROOT",(allocator *)&functionMapCode);
      pcVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&forwardDeclareCode);
      std::__cxx11::string::string((string *)&configFile,pcVar8,(allocator *)&sourceListValue);
      std::__cxx11::string::~string((string *)&forwardDeclareCode);
      std::__cxx11::string::append((char *)&configFile);
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      sourceName = pbVar4 + 2;
      for (psVar10 = sourceName;
          psVar10 !=
          tests.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
        bVar5 = std::operator==(psVar10,"EXTRA_INCLUDE");
        if (bVar5) break;
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__ = &sourceListValue;
        cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,psVar10);
        sVar3 = sourceListValue._M_string_length;
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        if (sVar3 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(__return_storage_ptr__,psVar10);
          std::__cxx11::string::operator=
                    ((string *)&functionMapCode,(string *)__return_storage_ptr__);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_f0,psVar10);
          std::operator+(&local_1b8,&local_f0,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_70,psVar10);
          std::operator+(&sourceListValue,&local_1b8,&local_70);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_1b8);
          __return_storage_ptr__ = &local_f0;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
        cmsys::SystemTools::ReplaceString(&functionMapCode," ","_");
        cmsys::SystemTools::ReplaceString(&functionMapCode,"/","_");
        cmsys::SystemTools::ReplaceString(&functionMapCode,":","_");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests_func_name,&functionMapCode);
        std::__cxx11::string::append((char *)&forwardDeclareCode);
        std::__cxx11::string::append((string *)&forwardDeclareCode);
        std::__cxx11::string::append((char *)&forwardDeclareCode);
        std::__cxx11::string::~string((string *)&functionMapCode);
      }
      functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
      functionMapCode._M_string_length = 0;
      functionMapCode.field_2._M_local_buf[0] = '\0';
      for (psVar10 = sourceName;
          psVar10 !=
          tests.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        sourceListValue._M_string_length = 0;
        sourceListValue.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(&local_1b8,psVar10);
        sVar3 = local_1b8._M_string_length;
        std::__cxx11::string::~string((string *)&local_1b8);
        if (sVar3 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1b8,psVar10);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_70,psVar10);
          std::operator+(&local_f0,&local_70,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,psVar10);
          std::operator+(&local_1b8,&local_f0,&local_50);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_70);
        }
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (extraInclude._M_string_length != 0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                   (allocator *)&local_1b8);
        cmMakefile::AddDefinition(pcVar2,&sourceListValue,extraInclude._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (function._M_string_length != 0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                   (allocator *)&local_1b8);
        cmMakefile::AddDefinition(pcVar2,&sourceListValue,function._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS",(allocator *)&local_1b8);
      cmMakefile::AddDefinition(pcVar2,&sourceListValue,forwardDeclareCode._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sourceListValue);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTIRES",(allocator *)&local_1b8);
      cmMakefile::AddDefinition(pcVar2,&sourceListValue,functionMapCode._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sourceListValue);
      pcVar2 = (this->super_cmCommand).Makefile;
      cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&sourceListValue);
      iVar6 = cmMakefile::ConfigureFile
                        (pcVar2,configFile._M_dataplus._M_p,driver._M_dataplus._M_p,false,true,false
                         ,(cmNewLineStyle *)&sourceListValue);
      bVar5 = iVar6 != 0;
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_local_buf[0] = '\0';
      pcVar9 = cmMakefile::GetOrCreateSource((this->super_cmCommand).Makefile,&driver,false);
      std::__cxx11::string::string((string *)&local_1b8,"ABSTRACT",(allocator *)&local_f0);
      cmSourceFile::SetProperty(pcVar9,&local_1b8,"0");
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      for (; pcVar2 = (this->super_cmCommand).Makefile,
          sourceName !=
          tests.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; sourceName = sourceName + 1) {
        pcVar9 = cmMakefile::GetOrCreateSource(pcVar2,sourceName,false);
        std::__cxx11::string::string((string *)&local_1b8,"ABSTRACT",(allocator *)&local_f0);
        cmSourceFile::SetProperty(pcVar9,&local_1b8,"0");
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::append((char *)&sourceListValue);
        std::__cxx11::string::append((string *)&sourceListValue);
      }
      std::__cxx11::string::string((string *)&local_1b8,pcVar1,(allocator *)&local_f0);
      cmMakefile::AddDefinition(pcVar2,&local_1b8,sourceListValue._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::~string((string *)&functionMapCode);
      std::__cxx11::string::~string((string *)&forwardDeclareCode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      std::__cxx11::string::~string((string *)&configFile);
      std::__cxx11::string::~string((string *)&driver);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    std::__cxx11::string::~string((string *)&function);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  return bVar5;
}

Assistant:

bool cmCreateTestSourceList
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size() < 3)
    {
    this->SetError("called with wrong number of arguments.");
    return false;
    }


  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for(; i != args.end(); i++)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
        }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
      }
    else if(*i == "FUNCTION")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
        }
      function = *i;
      function += "(&ac, &av);\n";
      }
    else
      {
      tests.push_back(*i);
      }
    }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2)
    {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
    }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile =
    this->Makefile->GetRequiredDefinition("CMAKE_ROOT");

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for(i = testsBegin; i != tests.end(); ++i)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      break;
      }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    cmSystemTools::ReplaceString(func_name, " ", "_");
    cmSystemTools::ReplaceString(func_name, "/", "_");
    cmSystemTools::ReplaceString(func_name, ":", "_");
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
    }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for(i = testsBegin, j = tests_func_name.begin(); i != tests.end(); ++i, ++j)
    {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    functionMapCode += "  {\n"
      "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
      "    ";
    functionMapCode +=  *j;
    functionMapCode += "\n"
      "  },\n";
    numTests++;
    }
  if(!extraInclude.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
    }
  if(!function.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
    }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
    forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
    functionMapCode.c_str());
  bool res = true;
  if ( !this->Makefile->ConfigureFile(configFile.c_str(), driver.c_str(),
      false, true, false) )
    {
    res = false;
    }

  // Construct the source list.
  std::string sourceListValue;
  {
  cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
  sf->SetProperty("ABSTRACT","0");
  sourceListValue = args[1];
  }
  for(i = testsBegin; i != tests.end(); ++i)
    {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT","0");
    sourceListValue += ";";
    sourceListValue += *i;
    }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}